

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_38;
  int local_28;
  int local_24;
  int iFanout;
  int i;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_28 = -1;
  iVar2 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar2 = Saig_ObjIsPo(p,pObj);
    if (iVar2 == 0) {
      iVar2 = Saig_ObjIsLi(p,pObj);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsCi(pObj);
        if ((iVar2 == 0) && (iVar2 = Aig_ObjIsNode(pObj), iVar2 == 0)) {
          __assert_fail("Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                        ,0x28d,"void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        pAVar3 = Aig_ObjRepr(p,pObj);
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          if (p->pFanData == (int *)0x0) {
            __assert_fail("p->pFanData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                          ,0x291,
                          "void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)");
          }
          local_24 = 0;
          while( true ) {
            bVar1 = false;
            if (local_24 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
              if (local_24 == 0) {
                local_38 = Aig_ObjFanout0Int(p,pObj->Id);
              }
              else {
                local_38 = Aig_ObjFanoutNext(p,local_28);
              }
              local_28 = local_38;
              _iFanout = Aig_ManObj(p,local_38 >> 1);
              bVar1 = true;
            }
            if (!bVar1) break;
            Saig_StrSimSetContiguousMatching_rec(p,_iFanout);
            local_24 = local_24 + 1;
          }
          iVar2 = Aig_ObjIsCi(pObj);
          if (iVar2 == 0) {
            pAVar3 = Aig_ObjFanin0(pObj);
            Saig_StrSimSetContiguousMatching_rec(p,pAVar3);
            pAVar3 = Aig_ObjFanin1(pObj);
            Saig_StrSimSetContiguousMatching_rec(p,pAVar3);
          }
        }
      }
      else {
        pAVar3 = Saig_ObjLiToLo(p,pObj);
        Saig_StrSimSetContiguousMatching_rec(p,pAVar3);
      }
    }
  }
  return;
}

Assistant:

void Saig_StrSimSetContiguousMatching_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPo( p, pObj ) )
        return;
    if ( Saig_ObjIsLi( p, pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Saig_ObjLiToLo(p, pObj) );
        return;
    }
    assert( Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj) );
    if ( Aig_ObjRepr(p, pObj) == NULL )
        return;
    // go through the fanouts
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_StrSimSetContiguousMatching_rec( p, pFanout );
    // go through the fanins
    if ( !Aig_ObjIsCi( pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin0(pObj) );
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin1(pObj) );
    }
}